

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_accessors.c
# Opt level: O2

uint32_t aec_get_lsb_24(aec_stream *strm)

{
  uint3 uVar1;
  
  uVar1 = *(uint3 *)strm->next_in;
  strm->next_in = (uchar *)((long)strm->next_in + 3);
  strm->avail_in = strm->avail_in - 3;
  return (uint)uVar1;
}

Assistant:

uint32_t aec_get_lsb_24(struct aec_stream *strm)
{
    uint32_t data = ((uint32_t)strm->next_in[2] << 16)
        | ((uint32_t)strm->next_in[1] << 8)
        | (uint32_t)strm->next_in[0];

    strm->next_in += 3;
    strm->avail_in -= 3;
    return data;
}